

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O2

String * MathML::StringUtil::replaceAll
                   (String *__return_storage_ptr__,String *str,char pattern,char replacement)

{
  long lVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,(ulong)(uint)(int)pattern);
    if (lVar1 == -1) break;
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar1] = replacement;
  }
  return __return_storage_ptr__;
}

Assistant:

MathML::String StringUtil::replaceAll( const String& str, char pattern, char replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string[ position ] = replacement;
            position = string.find( pattern );
        }

        return string;
    }